

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLItableMerging.cpp
# Opt level: O2

void __thiscall anon_func::TypeRewriter::~TypeRewriter(TypeRewriter *this)

{
  ::wasm::GlobalTypeRewriter::~GlobalTypeRewriter(&this->super_GlobalTypeRewriter);
  operator_delete(this,0x70);
  return;
}

Assistant:

void updateTypes(Module& wasm) {
    class TypeRewriter : public GlobalTypeRewriter {
      J2CLItableMerging& parent;

    public:
      TypeRewriter(Module& wasm, J2CLItableMerging& parent)
        : GlobalTypeRewriter(wasm), parent(parent) {}

      void modifyStruct(HeapType oldStructType, Struct& struct_) override {
        if (parent.structInfoByVtableType.count(oldStructType)) {
          auto& newFields = struct_.fields;

          auto structInfo = parent.structInfoByVtableType[oldStructType];
          // Add the itable fields to the beginning of the vtable.
          auto it = structInfo->itable.getStruct().fields.rbegin();
          while (it != structInfo->itable.getStruct().fields.rend()) {
            newFields.insert(newFields.begin(), *it++);
            newFields[0].type = getTempType(newFields[0].type);
          }

          // Update field names as well. The Type Rewriter cannot do this for
          // us, as it does not know which old fields map to which new ones
          // (it just keeps the names in sequence).
          auto& nameInfo = wasm.typeNames[oldStructType];

          // Make a copy of the old ones before clearing them.
          auto oldFieldNames = nameInfo.fieldNames;

          // Clear the old names and write the new ones.
          nameInfo.fieldNames.clear();
          // Only need to preserve the field names for the vtable fields; the
          // itable fields do not have names (in the original .wat file they
          // are accessed by index).
          for (Index i = 0; i < oldFieldNames.size(); i++) {
            nameInfo.fieldNames[i + parent.itableSize] = oldFieldNames[i];
          }
        }
      }
    };

    TypeRewriter(wasm, *this).update();
  }